

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O1

void ImGuizmo::DecomposeMatrixToComponents
               (float *matrix,float *translation,float *rotation,float *scale)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_68;
  float fStack_64;
  float local_58;
  
  fVar10 = (float)*(undefined8 *)matrix;
  fVar11 = (float)((ulong)*(undefined8 *)matrix >> 0x20);
  fVar12 = (float)*(undefined8 *)(matrix + 4);
  fVar8 = (float)((ulong)*(undefined8 *)(matrix + 4) >> 0x20);
  fVar13 = (float)*(undefined8 *)(matrix + 6);
  uVar4 = *(undefined8 *)(matrix + 8);
  uVar5 = *(undefined8 *)(matrix + 10);
  fVar1 = matrix[0xc];
  fVar2 = matrix[0xd];
  fVar3 = matrix[0xe];
  fVar9 = matrix[2];
  fVar6 = fVar9 * fVar9 + fVar10 * fVar10 + fVar11 * fVar11;
  if (fVar6 < 0.0) {
    fVar7 = sqrtf(fVar6);
  }
  else {
    fVar7 = SQRT(fVar6);
  }
  *scale = fVar7;
  fVar12 = fVar13 * fVar13 + fVar12 * fVar12 + fVar8 * fVar8;
  if (fVar12 < 0.0) {
    fVar8 = sqrtf(fVar12);
  }
  else {
    fVar8 = SQRT(fVar12);
  }
  scale[1] = fVar8;
  local_68 = (float)uVar4;
  fStack_64 = (float)((ulong)uVar4 >> 0x20);
  local_58 = (float)uVar5;
  fVar8 = local_58 * local_58 + local_68 * local_68 + fStack_64 * fStack_64;
  if (fVar8 < 0.0) {
    fVar7 = sqrtf(fVar8);
  }
  else {
    fVar7 = SQRT(fVar8);
  }
  scale[2] = fVar7;
  if (fVar6 < 0.0) {
    fVar6 = sqrtf(fVar6);
  }
  else {
    fVar6 = SQRT(fVar6);
  }
  if (fVar12 < 0.0) {
    fVar12 = sqrtf(fVar12);
  }
  else {
    fVar12 = SQRT(fVar12);
  }
  fVar6 = 1.0 / fVar6;
  fVar13 = fVar13 * (1.0 / fVar12);
  if (fVar8 < 0.0) {
    fVar8 = sqrtf(fVar8);
  }
  else {
    fVar8 = SQRT(fVar8);
  }
  local_58 = local_58 * (1.0 / fVar8);
  fVar12 = atan2f(fVar13,local_58);
  *rotation = fVar12 * 57.295776;
  fVar13 = fVar13 * fVar13 + local_58 * local_58;
  if (fVar13 < 0.0) {
    fVar13 = sqrtf(fVar13);
  }
  else {
    fVar13 = SQRT(fVar13);
  }
  fVar9 = atan2f(fVar9 * -fVar6,fVar13);
  rotation[1] = fVar9 * 57.295776;
  fVar9 = atan2f(fVar11 * fVar6,fVar10 * fVar6);
  rotation[2] = fVar9 * 57.295776;
  *translation = fVar1;
  translation[1] = fVar2;
  translation[2] = fVar3;
  return;
}

Assistant:

void DecomposeMatrixToComponents(const float *matrix, float *translation, float *rotation, float *scale)
   {
      matrix_t mat = *(matrix_t*)matrix;

      scale[0] = mat.v.right.Length();
      scale[1] = mat.v.up.Length();
      scale[2] = mat.v.dir.Length(); 

      mat.OrthoNormalize();

      rotation[0] = RAD2DEG * atan2f(mat.m[1][2], mat.m[2][2]);
      rotation[1] = RAD2DEG * atan2f(-mat.m[0][2], sqrtf(mat.m[1][2] * mat.m[1][2] + mat.m[2][2]* mat.m[2][2]));
      rotation[2] = RAD2DEG * atan2f(mat.m[0][1], mat.m[0][0]);

      translation[0] = mat.v.position.x;
      translation[1] = mat.v.position.y;
      translation[2] = mat.v.position.z;
   }